

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

char * fl_getcwd(char *b,int l)

{
  char *pcVar1;
  char *pcStack_10;
  int l_local;
  char *b_local;
  
  pcStack_10 = b;
  if (b == (char *)0x0) {
    pcStack_10 = (char *)malloc((long)(l + 1));
  }
  pcVar1 = getcwd(pcStack_10,(long)l);
  return pcVar1;
}

Assistant:

char *fl_getcwd(char* b, int l) {

  if (b == NULL) {
    b = (char*) malloc(l+1);
  }

#if defined(WIN32) && !defined(__CYGWIN__) // Windows

  static xchar *wbuf = NULL;
  wbuf = (xchar*)realloc(wbuf, sizeof(xchar) * (l+1));
  xchar *ret = _wgetcwd(wbuf, l);
  if (ret) {
    unsigned dstlen = l;
    l = (int) wcslen(wbuf);
    dstlen = fl_utf8fromwc(b, dstlen, wbuf, (unsigned) l);
    b[dstlen] = 0;
    return b;
  } else {
    return NULL;
  }

#else // other platforms

  return getcwd(b, l);

#endif

}